

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_haiku.c
# Opt level: O1

int main(int argc,char **argv)

{
  Flair *pFVar1;
  bool bVar2;
  double dVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ALLEGRO_SAMPLE *pAVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  Flair **ppFVar12;
  Sprite *pSVar13;
  int i;
  ulong uVar14;
  Interp func;
  Flair *pFVar15;
  Flair *pFVar16;
  bool bVar17;
  Token *pTVar18;
  float *pfVar19;
  char *format;
  int iVar20;
  long lVar21;
  ALLEGRO_SAMPLE *(*papAVar22) [8];
  int y;
  int iVar23;
  float fVar24;
  undefined4 uVar25;
  float duration;
  float fVar26;
  float fVar27;
  ALLEGRO_EVENT event;
  int local_b8 [2];
  ALLEGRO_TIMER *local_b0;
  int local_98;
  int local_94;
  int local_78;
  
  cVar4 = al_install_system(0x85020700,atexit);
  if (cVar4 == '\0') {
    format = "Error initialising Allegro.\n";
  }
  else {
    cVar4 = al_install_audio();
    if (cVar4 == '\0') goto LAB_00103d20;
    cVar4 = al_reserve_samples(0x80);
    if (cVar4 == '\0') goto LAB_00103d20;
    al_init_acodec_addon();
    al_init_image_addon();
    al_set_new_bitmap_flags(0xc0);
    display = (ALLEGRO_DISPLAY *)al_create_display(0x400,600);
    if (display == (ALLEGRO_DISPLAY *)0x0) {
      format = "Error creating display.\n";
    }
    else {
      al_set_window_title(display,"Haiku - A Musical Instrument");
      images[0] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/earth4.png");
      images[1] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/wind3.png");
      images[2] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/water.png");
      images[3] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/fire.png");
      images[4] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/black_bead_opaque_A.png");
      images[5] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/dropshadow.png");
      images[8] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/air_effect.png");
      images[9] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/water_droplets.png");
      images[10] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/flame2.png");
      images[0xb] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/main_flame2.png");
      images[6] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/healthy_glow.png");
      images[7] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/overlay_pretty.png");
      lVar8 = 0;
      do {
        if (*(long *)((long)images + lVar8) == 0) goto LAB_00103d12;
        lVar8 = lVar8 + 8;
      } while (lVar8 != 0x60);
      papAVar22 = element_samples;
      lVar8 = 0;
      do {
        iVar23 = (&DAT_00105264)[lVar8];
        lVar21 = 0;
        do {
          sprintf((char *)local_b8,"data/haiku/%s_%d.ogg",(long)&DAT_00105264 + (long)iVar23);
          pAVar9 = (ALLEGRO_SAMPLE *)al_load_sample(local_b8);
          (*papAVar22)[lVar21] = pAVar9;
          if (pAVar9 == (ALLEGRO_SAMPLE *)0x0) {
            abort_example("Error loading %s.\n",local_b8);
            goto LAB_00103d12;
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 != 8);
        lVar8 = lVar8 + 1;
        papAVar22 = papAVar22 + 1;
      } while (lVar8 != 4);
      select_sample = (ALLEGRO_SAMPLE *)al_load_sample("data/haiku/select.ogg");
      if (select_sample != (ALLEGRO_SAMPLE *)0x0) {
        uVar14 = 0;
        pTVar18 = tokens;
        do {
          uVar6 = (uint)(uVar14 >> 4) & 0xfffffff;
          fVar26 = (float)((uint)uVar14 & 0xf) * 51.2 + 125.6;
          fVar27 = (float)uVar6 * 51.2 + 80.0;
          tokens[uVar14].type = 4;
          tokens[uVar14].x = fVar26;
          tokens[uVar14].y = fVar27;
          tokens[uVar14].pitch = 7 - uVar6;
          tokens[uVar14].bot.image = 4;
          tokens[uVar14].bot.x = fVar26;
          tokens[uVar14].bot.y = fVar27;
          tokens[uVar14].bot.scale_x = 0.8;
          tokens[uVar14].bot.align_x = 0.5;
          tokens[uVar14].bot.g = 1.0;
          tokens[uVar14].bot.b = 1.0;
          tokens[uVar14].bot.scale_y = 0.8;
          tokens[uVar14].bot.align_y = 0.5;
          tokens[uVar14].bot.angle = 0.0;
          tokens[uVar14].bot.r = 1.0;
          tokens[uVar14].bot.opacity = 0.4;
          lVar8 = 0x40;
          do {
            *(undefined8 *)((long)((pTVar18->bot).anims + -2) + lVar8) = 0;
            lVar8 = lVar8 + 0x20;
          } while (lVar8 != 0x180);
          tokens[uVar14].top.image = 4;
          tokens[uVar14].top.x = fVar26;
          tokens[uVar14].top.y = fVar27;
          tokens[uVar14].top.scale_x = 0.8;
          tokens[uVar14].top.align_x = 0.5;
          tokens[uVar14].top.g = 1.0;
          tokens[uVar14].top.b = 1.0;
          tokens[uVar14].top.scale_y = 0.8;
          tokens[uVar14].top.align_y = 0.5;
          tokens[uVar14].top.angle = 0.0;
          tokens[uVar14].top.r = 1.0;
          tokens[uVar14].top.opacity = 0.0;
          lVar8 = 0x1b0;
          do {
            *(undefined8 *)((long)((pTVar18->bot).anims + -2) + lVar8) = 0;
            lVar8 = lVar8 + 0x20;
          } while (lVar8 != 0x2f0);
          uVar14 = uVar14 + 1;
          pTVar18 = pTVar18 + 1;
        } while (uVar14 != 0x80);
        lVar8 = 0;
        pTVar18 = buttons;
        do {
          fVar26 = (float)(&DAT_00105170)[lVar8] * 150.0 + 512.0;
          buttons[lVar8].type = (uint)lVar8;
          buttons[lVar8].x = fVar26;
          buttons[lVar8].y = 520.0;
          buttons[lVar8].bot.image = 5;
          buttons[lVar8].bot.x = fVar26;
          buttons[lVar8].bot.scale_x = 0.6;
          buttons[lVar8].bot.align_x = 0.5;
          buttons[lVar8].bot.y = 520.0;
          buttons[lVar8].bot.scale_y = 0.6;
          buttons[lVar8].bot.align_y = 0.5;
          buttons[lVar8].bot.angle = 0.0;
          buttons[lVar8].bot.r = 1.0;
          buttons[lVar8].bot.g = 1.0;
          buttons[lVar8].bot.b = 1.0;
          buttons[lVar8].bot.opacity = 0.4;
          lVar21 = 0x40;
          do {
            *(undefined8 *)((long)((pTVar18->bot).anims + -2) + lVar21) = 0;
            lVar21 = lVar21 + 0x20;
          } while (lVar21 != 0x180);
          buttons[lVar8].bot.align_y = 0.0;
          buttons[lVar8].top.image = (uint)lVar8;
          buttons[lVar8].top.x = fVar26;
          buttons[lVar8].top.scale_x = 0.8;
          buttons[lVar8].top.align_x = 0.5;
          buttons[lVar8].top.y = 520.0;
          buttons[lVar8].top.scale_y = 0.8;
          buttons[lVar8].top.align_y = 0.5;
          buttons[lVar8].top.angle = 0.0;
          buttons[lVar8].top.r = 1.0;
          buttons[lVar8].top.g = 1.0;
          buttons[lVar8].top.b = 1.0;
          buttons[lVar8].top.opacity = 1.0;
          lVar21 = 0x1b0;
          do {
            *(undefined8 *)((long)((pTVar18->bot).anims + -2) + lVar21) = 0;
            lVar21 = lVar21 + 0x20;
          } while (lVar21 != 0x2f0);
          lVar8 = lVar8 + 1;
          pTVar18 = pTVar18 + 1;
        } while (lVar8 != 4);
        glow.image = 6;
        glow.x = 512.0;
        glow.scale_x = 1.0;
        glow.align_x = 0.5;
        glow.y = 600.0;
        uVar25 = 0x3f800000;
        fVar26 = 0.5;
        glow.scale_y = 1.0;
        glow.angle = 0.0;
        glow.opacity = 1.0;
        lVar8 = 0x30;
        do {
          *(undefined8 *)((long)glow.anims + lVar8 + -0x30) = 0;
          lVar8 = lVar8 + 0x20;
        } while (lVar8 != 0x170);
        glow.align_y = 1.0;
        glow.b = 0.0;
        glow.r = 0.0;
        glow.g = 0.0;
        glow_overlay.image = 7;
        glow_overlay.x = 0.0;
        glow_overlay.scale_x = 1.0;
        glow_overlay.y = 0.0;
        glow_overlay.scale_y = 1.0;
        glow_overlay.angle = 0.0;
        glow_overlay.opacity = 1.0;
        lVar8 = 0x30;
        do {
          *(undefined8 *)((long)glow_overlay.anims + lVar8 + -0x30) = 0;
          lVar8 = lVar8 + 0x20;
        } while (lVar8 != 0x170);
        glow_overlay.align_x = 0.0;
        glow_overlay.align_y = 0.0;
        glow_overlay.b = 0.0;
        glow_overlay.r = 0.0;
        glow_overlay.g = 0.0;
        uVar10 = al_map_rgb(0x6b,0x8e,0x23);
        glow_color[0].b = (float)uVar25;
        glow_color[0].r = (float)(int)uVar10;
        glow_color[0].g = (float)(int)((ulong)uVar10 >> 0x20);
        glow_color[0].a = fVar26;
        uVar10 = al_map_rgb(0xad,0xd8,0xe6);
        glow_color[1].b = (float)uVar25;
        glow_color[1].r = (float)(int)uVar10;
        glow_color[1].g = (float)(int)((ulong)uVar10 >> 0x20);
        glow_color[1].a = fVar26;
        uVar10 = al_map_rgb(0x41,0x69,0xe1);
        glow_color[2].b = (float)uVar25;
        glow_color[2].r = (float)(int)uVar10;
        glow_color[2].g = (float)(int)((ulong)uVar10 >> 0x20);
        glow_color[2].a = fVar26;
        uVar10 = al_map_rgb(0xff,0,0);
        glow_color[3].b = (float)uVar25;
        glow_color[3].r = (float)(int)uVar10;
        glow_color[3].g = (float)(int)((ulong)uVar10 >> 0x20);
        glow_color[3].a = fVar26;
        select_button(buttons);
        al_install_keyboard();
        al_install_mouse();
        refresh_timer = (ALLEGRO_TIMER *)al_create_timer(0x11111111);
        playback_timer = (ALLEGRO_TIMER *)al_create_timer(0x60000000);
        uVar10 = al_create_event_queue();
        uVar11 = al_get_display_event_source(display);
        al_register_event_source(uVar10,uVar11);
        uVar11 = al_get_keyboard_event_source();
        al_register_event_source(uVar10,uVar11);
        uVar11 = al_get_mouse_event_source();
        al_register_event_source(uVar10,uVar11);
        uVar11 = al_get_timer_event_source(refresh_timer);
        al_register_event_source(uVar10,uVar11);
        uVar11 = al_get_timer_event_source(playback_timer);
        al_register_event_source(uVar10,uVar11);
        cVar4 = al_is_touch_input_installed();
        if (cVar4 != '\0') {
          uVar11 = al_get_touch_input_mouse_emulation_event_source();
          al_register_event_source(uVar10,uVar11);
        }
        al_start_timer(refresh_timer);
        al_start_timer(playback_timer);
        bVar17 = true;
LAB_00102bb1:
        do {
          while( true ) {
            do {
              bVar2 = bVar17;
              if ((bVar17) && (cVar4 = al_is_event_queue_empty(uVar10), cVar4 != '\0')) {
                dVar3 = (double)al_get_time();
                fVar26 = (float)dVar3;
                if (flairs != (Flair *)0x0) {
                  pFVar15 = (Flair *)0x0;
                  pFVar16 = flairs;
                  do {
                    pFVar1 = pFVar16->next;
                    if (pFVar16->end_time <= fVar26) {
                      ppFVar12 = &pFVar15->next;
                      if (pFVar15 == (Flair *)0x0) {
                        ppFVar12 = &flairs;
                      }
                      ((Flair *)ppFVar12)->next = pFVar1;
                      free(pFVar16);
                      pFVar16 = pFVar15;
                    }
                    pFVar15 = pFVar16;
                    pFVar16 = pFVar1;
                  } while (pFVar1 != (Flair *)0x0);
                }
                lVar8 = 0x80;
                pSVar13 = &tokens[0].top;
                do {
                  update_sprite_anims(pSVar13 + -1,fVar26);
                  update_sprite_anims(pSVar13,fVar26);
                  pSVar13 = (Sprite *)&pSVar13[2].y;
                  lVar8 = lVar8 + -1;
                } while (lVar8 != 0);
                lVar8 = 4;
                pSVar13 = &buttons[0].top;
                do {
                  update_sprite_anims(pSVar13 + -1,fVar26);
                  update_sprite_anims(pSVar13,fVar26);
                  pSVar13 = (Sprite *)&pSVar13[2].y;
                  lVar8 = lVar8 + -1;
                } while (lVar8 != 0);
                update_sprite_anims(&glow,fVar26);
                update_sprite_anims(&glow_overlay,fVar26);
                for (pFVar16 = flairs; pFVar16 != (Flair *)0x0; pFVar16 = pFVar16->next) {
                  update_sprite_anims(&pFVar16->sprite,fVar26);
                }
                al_map_rgb(0,0,0);
                al_clear_to_color();
                al_set_blender(0,2,1);
                draw_sprite(&glow);
                draw_sprite(&glow_overlay);
                lVar8 = 0x80;
                pSVar13 = &tokens[0].top;
                do {
                  draw_sprite(pSVar13 + -1);
                  draw_sprite(pSVar13);
                  pSVar13 = (Sprite *)&pSVar13[2].y;
                  lVar8 = lVar8 + -1;
                } while (lVar8 != 0);
                al_set_blender(0,1,3);
                lVar8 = 4;
                pSVar13 = &buttons[0].top;
                do {
                  draw_sprite(pSVar13 + -1);
                  draw_sprite(pSVar13);
                  pSVar13 = (Sprite *)&pSVar13[2].y;
                  lVar8 = lVar8 + -1;
                } while (lVar8 != 0);
                al_set_blender(0,2,1);
                for (pFVar16 = flairs; pFVar16 != (Flair *)0x0; pFVar16 = pFVar16->next) {
                  draw_sprite(&pFVar16->sprite);
                }
                al_flip_display();
                bVar2 = false;
              }
              al_wait_for_event();
              bVar17 = true;
            } while (local_b0 == refresh_timer);
            bVar17 = bVar2;
            if (local_b0 != playback_timer) break;
            iVar23 = 0;
            do {
              lVar8 = (long)playback_column + (long)iVar23 * 0x10;
              if (3 < tokens[lVar8].type) goto LAB_00103aa3;
              pSVar13 = &tokens[lVar8].top;
              switch(tokens[lVar8].type) {
              case 0:
                al_play_sample(0x3f4ccccd,0,0x3f800000,element_samples[0][tokens[lVar8].pitch],0x100
                               ,0);
                fVar26 = tokens[lVar8].top.scale_x;
                anim_full(pSVar13,&tokens[lVar8].top.scale_x,fVar26 + 0.4,fVar26,INTERP_FAST,0.0,0.3
                         );
                fVar26 = tokens[lVar8].top.scale_y;
                pfVar19 = &tokens[lVar8].top.scale_y;
                fVar27 = fVar26 + 0.4;
                fVar24 = 0.3;
                goto LAB_00103a9e;
              case 1:
                al_play_sample(0x3f4ccccd,0,element_samples[1][tokens[lVar8].pitch],0x100,0);
                pfVar19 = &tokens[lVar8].top.scale_x;
                anim_full(pSVar13,pfVar19,0.8,0.64,INTERP_SLOW_IN_OUT,0.0,0.5);
                anim_full(pSVar13,pfVar19,0.64,0.8,INTERP_SLOW_IN_OUT,0.5,0.8);
                pfVar19 = &tokens[lVar8].top.scale_y;
                anim_full(pSVar13,pfVar19,0.8,0.64,INTERP_SLOW_IN_OUT,0.0,0.5);
                anim_full(pSVar13,pfVar19,0.64,0.8,INTERP_SLOW_IN_OUT,0.5,0.8);
                fVar26 = tokens[lVar8].top.x;
                fVar27 = tokens[lVar8].top.y;
                dVar3 = (double)al_get_time();
                pSVar13 = make_flair(8,fVar26,fVar27,(float)dVar3 + 1.0);
                anim_full(pSVar13,&pSVar13->scale_x,0.9,1.3,INTERP_FAST,0.0,1.0);
                anim_full(pSVar13,&pSVar13->scale_y,0.9,1.3,INTERP_FAST,0.0,1.0);
                anim_full(pSVar13,&pSVar13->opacity,1.0,0.0,INTERP_FAST,0.0,1.0);
                pSVar13 = make_flair(8,fVar26,fVar27,(float)dVar3 + 1.2);
                anim_full(pSVar13,&pSVar13->opacity,1.0,0.0,INTERP_LINEAR,0.0,1.2);
                anim_full(pSVar13,&pSVar13->scale_x,1.1,1.5,INTERP_FAST,0.0,1.2);
                anim_full(pSVar13,&pSVar13->scale_y,1.1,0.5,INTERP_FAST,0.0,1.2);
                pfVar19 = &pSVar13->x;
                fVar27 = pSVar13->x;
                fVar26 = fVar27 + 10.0;
                fVar24 = 1.2;
LAB_00103a9e:
                anim_full(pSVar13,pfVar19,fVar27,fVar26,INTERP_FAST,0.0,fVar24);
                break;
              case 2:
                al_play_sample(0x3f333333,0x3f000000,element_samples[2][tokens[lVar8].pitch],0x100,0
                              );
                pfVar19 = &tokens[lVar8].top.scale_x;
                anim_full(pSVar13,pfVar19,1.04,0.64,INTERP_BOUNCE,0.0,0.5);
                anim_full(pSVar13,pfVar19,0.64,0.8,INTERP_BOUNCE,0.5,0.5);
                pfVar19 = &tokens[lVar8].top.scale_y;
                anim_full(pSVar13,pfVar19,0.64,1.04,INTERP_BOUNCE,0.0,0.5);
                anim_full(pSVar13,pfVar19,1.04,0.8,INTERP_BOUNCE,0.5,0.5);
                fVar26 = tokens[lVar8].top.x;
                fVar27 = tokens[lVar8].top.y;
                dVar3 = (double)al_get_time();
                pSVar13 = make_flair(2,fVar26,fVar27,(float)dVar3 + 1.0);
                anim_full(pSVar13,&pSVar13->scale_x,1.0,2.0,INTERP_FAST,0.0,0.5);
                anim_full(pSVar13,&pSVar13->scale_y,1.0,2.0,INTERP_FAST,0.0,0.5);
                anim_full(pSVar13,&pSVar13->opacity,0.5,0.0,INTERP_FAST,0.0,0.5);
                iVar20 = 9;
                do {
                  pSVar13 = make_flair(9,fVar26,fVar27,(float)dVar3 + 1.0);
                  iVar5 = rand();
                  fVar24 = (float)iVar5 * 4.656613e-10 * 0.90000004 + 0.3;
                  uVar6 = rand();
                  if ((uVar6 & 1) != 0) {
                    fVar24 = -fVar24;
                  }
                  pSVar13->scale_x = fVar24;
                  iVar5 = rand();
                  fVar24 = (float)iVar5 * 4.656613e-10 * 0.90000004 + 0.3;
                  uVar6 = rand();
                  if ((uVar6 & 1) != 0) {
                    fVar24 = -fVar24;
                  }
                  pSVar13->scale_y = fVar24;
                  iVar5 = rand();
                  pSVar13->angle = (float)iVar5 * 4.656613e-10 * 6.2831855 + 0.0;
                  iVar5 = rand();
                  pSVar13->r = (float)iVar5 * 4.656613e-10 * 0.6 + 0.0;
                  iVar5 = rand();
                  pSVar13->g = (float)iVar5 * 4.656613e-10 * 0.20000002 + 0.4;
                  pSVar13->b = 1.0;
                  if (iVar20 == 9) {
                    fVar24 = pSVar13->opacity;
                    func = INTERP_LINEAR;
                    duration = 1.0;
                  }
                  else {
                    iVar5 = rand();
                    duration = (float)iVar5 * 4.656613e-10 * 0.3 + 0.7;
                    fVar24 = pSVar13->opacity;
                    func = INTERP_DOUBLE_SLOW;
                  }
                  anim_full(pSVar13,&pSVar13->opacity,fVar24,0.0,func,0.0,duration);
                  iVar5 = rand();
                  iVar7 = rand();
                  anim_full(pSVar13,&pSVar13->scale_x,pSVar13->scale_x,
                            (float)iVar5 * 4.656613e-10 * 2.2 + 0.8,INTERP_FAST,0.0,
                            (float)iVar7 * 4.656613e-10 * 0.3 + 0.7);
                  iVar5 = rand();
                  iVar7 = rand();
                  anim_full(pSVar13,&pSVar13->scale_y,pSVar13->scale_y,
                            (float)iVar5 * 4.656613e-10 * 2.2 + 0.8,INTERP_FAST,0.0,
                            (float)iVar7 * 4.656613e-10 * 0.3 + 0.7);
                  iVar5 = rand();
                  fVar24 = (float)iVar5 * 4.656613e-10 * 20.0 + 0.0;
                  uVar6 = rand();
                  if ((uVar6 & 1) != 0) {
                    fVar24 = -fVar24;
                  }
                  iVar5 = rand();
                  anim_full(pSVar13,&pSVar13->x,pSVar13->x,fVar24 + pSVar13->x,INTERP_FAST,0.0,
                            (float)iVar5 * 4.656613e-10 * 0.3 + 0.7);
                  iVar5 = rand();
                  fVar24 = (float)iVar5 * 4.656613e-10 * 20.0 + 0.0;
                  uVar6 = rand();
                  if ((uVar6 & 1) != 0) {
                    fVar24 = -fVar24;
                  }
                  iVar5 = rand();
                  anim_full(pSVar13,&pSVar13->y,pSVar13->y,fVar24 + pSVar13->y,INTERP_FAST,0.0,
                            (float)iVar5 * 4.656613e-10 * 0.3 + 0.7);
                  iVar20 = iVar20 + -1;
                } while (iVar20 != 0);
                break;
              case 3:
                iVar20 = 0;
                al_play_sample(0x3f4ccccd,0,element_samples[3][tokens[lVar8].pitch],0x100,0);
                anim_full(pSVar13,&tokens[lVar8].top.scale_x,1.04,0.8,INTERP_SLOW_IN_OUT,0.0,1.0);
                anim_full(pSVar13,&tokens[lVar8].top.scale_y,1.04,0.8,INTERP_SLOW_IN_OUT,0.0,1.0);
                fVar26 = tokens[lVar8].top.x;
                fVar27 = tokens[lVar8].top.y;
                dVar3 = (double)al_get_time();
                pSVar13 = make_flair(0xb,fVar26,fVar27,(float)dVar3 + 0.8);
                pSVar13->align_y = 0.75;
                anim_full(pSVar13,&pSVar13->scale_x,0.2,1.3,INTERP_BOUNCE,0.0,0.4);
                anim_full(pSVar13,&pSVar13->scale_y,0.2,1.3,INTERP_BOUNCE,0.0,0.4);
                anim_full(pSVar13,&pSVar13->scale_x,1.3,1.4,INTERP_BOUNCE,0.4,0.5);
                anim_full(pSVar13,&pSVar13->scale_y,1.3,1.4,INTERP_BOUNCE,0.4,0.5);
                anim_full(pSVar13,&pSVar13->opacity,1.0,0.0,INTERP_FAST,0.3,0.5);
                do {
                  pSVar13 = make_flair(10,fVar26,fVar27,(float)dVar3 + 0.7);
                  pSVar13->align_x = 1.3;
                  fVar24 = (float)iVar20 * 2.0943952;
                  pSVar13->angle = fVar24;
                  anim_full(pSVar13,&pSVar13->angle,fVar24,fVar24 + -3.1415927,INTERP_DOUBLE_FAST,
                            0.0,0.7);
                  anim_full(pSVar13,&pSVar13->opacity,1.0,0.0,INTERP_SLOW,0.0,0.7);
                  anim_full(pSVar13,&pSVar13->scale_x,0.2,1.0,INTERP_FAST,0.0,0.7);
                  anim_full(pSVar13,&pSVar13->scale_y,0.2,1.0,INTERP_FAST,0.0,0.7);
                  iVar20 = iVar20 + 1;
                } while (iVar20 != 3);
              }
LAB_00103aa3:
              iVar23 = iVar23 + 1;
            } while (iVar23 != 8);
            bVar2 = 0xe < playback_column;
            playback_column = playback_column + 1;
            if (bVar2) {
              playback_column = 0;
            }
          }
          if (local_b8[0] < 0x15) {
            if (local_b8[0] == 10) {
              if (local_98 == 3) {
                lVar8 = 0;
                do {
                  unselect_token((Token *)((long)(tokens[0].bot.anims + -2) + lVar8));
                  lVar8 = lVar8 + 0x2f0;
                } while (lVar8 != 0x17800);
              }
              else if (local_98 == 0x3b) goto joined_r0x00103cd2;
            }
            else if ((local_b8[0] == 0x14) &&
                    (pTVar18 = get_touched_token((float)local_98,(float)local_94),
                    pTVar18 != hover_token)) {
              if (hover_token != (Token *)0x0) {
                anim_full(&hover_token->bot,&(hover_token->bot).opacity,(hover_token->bot).opacity,
                          0.4,INTERP_DOUBLE_SLOW,0.0,0.2);
              }
              hover_token = pTVar18;
              if (pTVar18 != (Token *)0x0) {
                anim_full(&pTVar18->bot,&(pTVar18->bot).opacity,(pTVar18->bot).opacity,0.7,
                          INTERP_FAST,0.0,0.2);
              }
            }
            goto LAB_00102bb1;
          }
          if (local_b8[0] == 0x15) {
            fVar26 = (float)local_98;
            fVar27 = (float)local_94;
            if (local_78 == 2) {
              pTVar18 = get_touched_token(fVar26,fVar27);
              if (pTVar18 != (Token *)0x0) {
                unselect_token(pTVar18);
              }
            }
            else if (local_78 == 1) {
              pTVar18 = get_touched_token(fVar26,fVar27);
              if (pTVar18 == (Token *)0x0) {
                lVar8 = 0;
                do {
                  fVar24 = *(float *)((long)buttons[0].bot.anims + lVar8 + -0x3c);
                  if ((((fVar24 + -32.0 <= fVar26) && (fVar26 < fVar24 + 32.0)) &&
                      (fVar24 = *(float *)((long)buttons[0].bot.anims + lVar8 + -0x38),
                      fVar24 + -32.0 <= fVar27)) && (fVar27 < fVar24 + 32.0)) {
                    pTVar18 = (Token *)((long)(buttons[0].bot.anims + -2) + lVar8);
                    goto LAB_00103ca9;
                  }
                  lVar8 = lVar8 + 0x2f0;
                } while (lVar8 != 0xbc0);
                pTVar18 = (Token *)0x0;
LAB_00103ca9:
                if (pTVar18 != (Token *)0x0) {
                  select_button(pTVar18);
                }
              }
              else if (selected_button != (Token *)0x0) {
                uVar6 = pTVar18->type;
                unselect_token(pTVar18);
                if (uVar6 != selected_button->type) {
                  (pTVar18->top).image = selected_button->type;
                  anim_full(&pTVar18->top,&(pTVar18->top).opacity,(pTVar18->top).opacity,1.0,
                            INTERP_FAST,0.0,0.15);
                  pTVar18->type = selected_button->type;
                }
              }
            }
          }
          else if (local_b8[0] == 0x2a) {
joined_r0x00103cd2:
            while (flairs != (Flair *)0x0) {
              pFVar16 = flairs->next;
              free(flairs);
              flairs = pFVar16;
            }
            glow.x = glow.x;
            glow.scale_x = glow.scale_x;
            glow.align_x = glow.align_x;
            glow.y = glow.y;
            return 0;
          }
        } while( true );
      }
      format = "Error loading select.ogg.\n";
      select_sample = (ALLEGRO_SAMPLE *)0x0;
    }
  }
LAB_00103d19:
  do {
    abort_example(format);
LAB_00103d20:
    format = "Error initialising audio.\n";
  } while( true );
LAB_00103d12:
  format = "Error loading image.\n";
  goto LAB_00103d19;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_EVENT_QUEUE *queue;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Error initialising Allegro.\n");
   }
   if (!al_install_audio() || !al_reserve_samples(128)) {
      abort_example("Error initialising audio.\n");
   }
   al_init_acodec_addon();
   al_init_image_addon();
   init_platform_specific();

   al_set_new_bitmap_flags(ALLEGRO_MIN_LINEAR | ALLEGRO_MAG_LINEAR);

   display = al_create_display(screen_w, screen_h);
   if (!display) {
      abort_example("Error creating display.\n");
   }
   al_set_window_title(display, "Haiku - A Musical Instrument");

   load_images();
   load_samples();

   init_tokens();
   init_buttons();
   init_glow();
   select_button(&buttons[TYPE_EARTH]);

   al_install_keyboard();
   al_install_mouse();

   refresh_timer = al_create_timer(1.0 / refresh_rate);
   playback_timer = al_create_timer(playback_period / TOKENS_X);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_mouse_event_source());
   al_register_event_source(queue, al_get_timer_event_source(refresh_timer));
   al_register_event_source(queue, al_get_timer_event_source(playback_timer));
   if (al_is_touch_input_installed()) {
      al_register_event_source(queue,
         al_get_touch_input_mouse_emulation_event_source());
   }

   al_start_timer(refresh_timer);
   al_start_timer(playback_timer);

   main_loop(queue);

   free_all_flairs();

   return 0;
}